

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

X509 * read_cert(char *filename)

{
  FILE *fp;
  X509 *pXVar1;
  
  fp = fopen(filename,"r");
  if (fp == (FILE *)0x0) {
    pXVar1 = (X509 *)0x0;
  }
  else {
    pXVar1 = PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (pXVar1 == (X509 *)0x0) {
      ERR_print_errors_fp(_stderr);
    }
    fclose(fp);
  }
  return (X509 *)pXVar1;
}

Assistant:

X509 *
read_cert(const char *filename)
{
	FILE *file;
	X509 *res;

	if (
#ifdef WIN32
		(fopen_s(&file, filename, "r"))
#else
		!(file = fopen(filename, "r"))
#endif
		)
	{
		return NULL;
	}

	if (!(res = PEM_read_X509(file, NULL, NULL, NULL)))
		ERR_print_errors_fp(stderr);

	fclose(file);

	return res;
}